

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_run_completed(uv_udp_t *handle)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  long *plVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  
  if ((handle->flags >> 0x11 & 1) != 0) {
    __assert_fail("!(handle->flags & UV_UDP_PROCESSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                  ,0x5f,"void uv__udp_run_completed(uv_udp_t *)");
  }
  handle->flags = handle->flags | 0x20000;
  plVar4 = (long *)handle->write_completed_queue[0];
  while( true ) {
    if (handle->write_completed_queue == (void **)plVar4) {
      if (handle->write_queue == (void **)handle->write_queue[0]) {
        uv__io_stop(handle->loop,&handle->io_watcher,4);
        iVar5 = uv__io_active(&handle->io_watcher,1);
        if (((iVar5 == 0) && (uVar3 = handle->flags, (uVar3 >> 0xe & 1) != 0)) &&
           (handle->flags = uVar3 & 0xffffbfff, (uVar3 >> 0xd & 1) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 - 1;
        }
      }
      pbVar2 = (byte *)((long)&handle->flags + 2);
      *pbVar2 = *pbVar2 & 0xfd;
      return;
    }
    *(long *)plVar4[1] = *plVar4;
    *(long *)(*plVar4 + 8) = plVar4[1];
    if (handle->loop->active_reqs == (void **)handle->loop->active_reqs[0]) break;
    *(long *)plVar4[-7] = plVar4[-8];
    *(long *)(plVar4[-8] + 8) = plVar4[-7];
    sVar6 = uv__count_bufs((uv_buf_t *)plVar4[0x13],*(uint *)(plVar4 + 0x12));
    handle->send_queue_size = handle->send_queue_size - sVar6;
    handle->send_queue_count = handle->send_queue_count - 1;
    if ((long *)plVar4[0x13] != plVar4 + 0x16) {
      uv__free((long *)plVar4[0x13]);
    }
    plVar4[0x13] = 0;
    if ((code *)plVar4[0x15] != (code *)0x0) {
      uVar7 = plVar4[0x14] & 0xffffffff;
      if (-1 < plVar4[0x14]) {
        uVar7 = 0;
      }
      (*(code *)plVar4[0x15])(plVar4 + -10,uVar7);
    }
    plVar4 = (long *)handle->write_completed_queue[0];
  }
  __assert_fail("uv__has_active_reqs(handle->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                ,0x67,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!(handle->flags & UV_HANDLE_UDP_PROCESSING));
  handle->flags |= UV_HANDLE_UDP_PROCESSING;

  while (!QUEUE_EMPTY(&handle->write_completed_queue)) {
    q = QUEUE_HEAD(&handle->write_completed_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (QUEUE_EMPTY(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_HANDLE_UDP_PROCESSING;
}